

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_pubkey_comparison(void)

{
  int iVar1;
  secp256k1_pubkey pk_tmp;
  int32_t ecount;
  secp256k1_pubkey pk2;
  secp256k1_pubkey pk1;
  uchar pk2_ser [33];
  uchar pk1_ser [33];
  _func_void_char_ptr_void_ptr *in_stack_fffffffffffffed8;
  secp256k1_context *in_stack_fffffffffffffee0;
  size_t in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_pubkey *in_stack_ffffffffffffff40;
  secp256k1_context *in_stack_ffffffffffffff48;
  secp256k1_context *in_stack_ffffffffffffff50;
  undefined1 local_58 [48];
  undefined1 local_28 [40];
  
  memcpy(local_28,&DAT_001632b0,0x21);
  memcpy(local_58,&DAT_001632e0,0x21);
  iVar1 = secp256k1_ec_pubkey_parse
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ae3,
            "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pk1, pk1_ser, sizeof(pk1_ser)) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_parse
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
  if (iVar1 == 1) {
    secp256k1_context_set_illegal_callback
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(void *)0x11d33c);
    iVar1 = secp256k1_ec_pubkey_cmp
                      (in_stack_ffffffffffffff50,(secp256k1_pubkey *)in_stack_ffffffffffffff48,
                       in_stack_ffffffffffffff40);
    if (iVar1 < 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1ae8,"test condition failed: ecount == 1");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ae7,"test condition failed: secp256k1_ec_pubkey_cmp(CTX, NULL, &pk2) < 0");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x1ae4,
          "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pk2, pk2_ser, sizeof(pk2_ser)) == 1"
         );
  abort();
}

Assistant:

static void run_pubkey_comparison(void) {
    unsigned char pk1_ser[33] = {
        0x02,
        0x58, 0x84, 0xb3, 0xa2, 0x4b, 0x97, 0x37, 0x88, 0x92, 0x38, 0xa6, 0x26, 0x62, 0x52, 0x35, 0x11,
        0xd0, 0x9a, 0xa1, 0x1b, 0x80, 0x0b, 0x5e, 0x93, 0x80, 0x26, 0x11, 0xef, 0x67, 0x4b, 0xd9, 0x23
    };
    const unsigned char pk2_ser[33] = {
        0x02,
        0xde, 0x36, 0x0e, 0x87, 0x59, 0x8f, 0x3c, 0x01, 0x36, 0x2a, 0x2a, 0xb8, 0xc6, 0xf4, 0x5e, 0x4d,
        0xb2, 0xc2, 0xd5, 0x03, 0xa7, 0xf9, 0xf1, 0x4f, 0xa8, 0xfa, 0x95, 0xa8, 0xe9, 0x69, 0x76, 0x1c
    };
    secp256k1_pubkey pk1;
    secp256k1_pubkey pk2;
    int32_t ecount = 0;

    CHECK(secp256k1_ec_pubkey_parse(CTX, &pk1, pk1_ser, sizeof(pk1_ser)) == 1);
    CHECK(secp256k1_ec_pubkey_parse(CTX, &pk2, pk2_ser, sizeof(pk2_ser)) == 1);

    secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, NULL, &pk2) < 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk1, NULL) > 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk2, &pk1) > 0);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk1, &pk1) == 0);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk2, &pk2) == 0);
    CHECK(ecount == 2);
    {
        secp256k1_pubkey pk_tmp;
        memset(&pk_tmp, 0, sizeof(pk_tmp)); /* illegal pubkey */
        CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk_tmp, &pk2) < 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk_tmp, &pk_tmp) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk2, &pk_tmp) > 0);
        CHECK(ecount == 6);
    }

    secp256k1_context_set_illegal_callback(CTX, NULL, NULL);

    /* Make pk2 the same as pk1 but with 3 rather than 2. Note that in
     * an uncompressed encoding, these would have the opposite ordering */
    pk1_ser[0] = 3;
    CHECK(secp256k1_ec_pubkey_parse(CTX, &pk2, pk1_ser, sizeof(pk1_ser)) == 1);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(secp256k1_ec_pubkey_cmp(CTX, &pk2, &pk1) > 0);
}